

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O2

void __thiscall HighsMipSolverData::printDisplayLine(HighsMipSolverData *this,int solution_source)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  HighsOptions *pHVar5;
  bool *__nbytes;
  uint uVar6;
  uint uVar7;
  int64_t val;
  long lVar8;
  void *in_RDX;
  char *pcVar9;
  HighsMipSolverData *pHVar10;
  uint uVar11;
  double dVar12;
  double extraout_XMM0_Qa;
  double dVar13;
  double dual_bound;
  double primal_bound;
  char acStack_130 [24];
  double local_118;
  double lb;
  array<char,_22UL> print_nodes;
  string time_string;
  array<char,_22UL> ub_string;
  array<char,_22UL> queue_nodes;
  array<char,_22UL> lb_string;
  array<char,_22UL> print_leaves;
  string local_70;
  double ub;
  array<char,_22UL> print_lp_iters;
  
  pHVar5 = this->mipsolver->options_mip_;
  __nbytes = (pHVar5->super_HighsOptionsStruct).log_options.output_flag;
  if (*__nbytes == true) {
    bVar3 = (pHVar5->super_HighsOptionsStruct).timeless_log;
    if (bVar3 == true) {
      dVar12 = this->disptime + 1.0;
    }
    else {
      HighsTimer::read(&this->mipsolver->timer_,0,in_RDX,(size_t)__nbytes);
      dVar12 = extraout_XMM0_Qa;
    }
    this->disptime = dVar12;
    if ((solution_source != -1) ||
       ((this->mipsolver->options_mip_->super_HighsOptionsStruct).mip_min_logging_interval <=
        dVar12 - this->last_disptime)) {
      this->last_disptime = dVar12;
      if (bVar3 == false) {
        highsFormatToString_abi_cxx11_(&time_string," %7.1fs");
      }
      else {
        std::__cxx11::string::string((string *)&time_string,"",(allocator *)&dual_bound);
      }
      lVar8 = this->num_disp_lines;
      if (lVar8 % 0x14 == 0) {
        if (lVar8 == 0) {
          printSolutionSourceKey(this);
        }
        pcVar9 = "      Work      ";
        if (bVar3 != false) {
          pcVar9 = "   Work";
        }
        std::__cxx11::string::string((string *)&dual_bound,pcVar9,(allocator *)&print_nodes);
        pcVar9 = "LpIters     Time";
        if (bVar3 != false) {
          pcVar9 = "LpIters";
        }
        std::__cxx11::string::string((string *)&print_nodes,pcVar9,(allocator *)&queue_nodes);
        highsLogUser(&(this->mipsolver->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
                     "\n        Nodes      |    B&B Tree     |            Objective Bounds              |  Dynamic Constraints | %s\nSrc  Proc. InQueue |  Leaves   Expl. | BestBound       BestSol              Gap |   Cuts   InLp Confl. | %s\n\n"
                     ,dual_bound,print_nodes._M_elems._0_8_);
        std::__cxx11::string::~string((string *)&print_nodes);
        std::__cxx11::string::~string((string *)&dual_bound);
        lVar8 = this->num_disp_lines;
      }
      this->num_disp_lines = lVar8 + 1;
      convertToPrintString(&print_nodes,this->num_nodes);
      val = HighsNodeQueue::numActiveNodes(&this->nodequeue);
      convertToPrintString(&queue_nodes,val);
      convertToPrintString(&print_leaves,this->num_leaves - this->num_leaves_before_run);
      dVar12 = (this->pruned_treeweight).hi;
      dVar2 = (this->pruned_treeweight).lo;
      dVar13 = limitsToGap(this,this->lower_bound,this->upper_bound,&lb,&ub);
      local_118 = (this->mipsolver->options_mip_->super_HighsOptionsStruct).objective_bound;
      if (ub <= local_118) {
        local_118 = ub;
      }
      convertToPrintString(&print_lp_iters,this->total_lp_iterations);
      iVar4 = (this->lp).lpsolver.model_.lp_.num_row_;
      if (iVar4 < 1) {
        uVar11 = 0;
      }
      else {
        uVar11 = iVar4 - ((this->lp).mipsolver)->model_->num_row_;
      }
      dVar12 = (dVar12 + dVar2) * 100.0;
      if (INFINITY <= this->upper_bound) {
        pdVar1 = &(this->mipsolver->options_mip_->super_HighsOptionsStruct).objective_bound;
        pcVar9 = "*";
        if (local_118 < *pdVar1 || local_118 == *pdVar1) {
          pcVar9 = "";
        }
        convertToPrintString
                  ((array<char,_22UL> *)&primal_bound,
                   (double)this->mipsolver->orig_model_->sense_ * local_118,pcVar9);
        pHVar10 = (HighsMipSolverData *)0x3a6f0e;
        convertToPrintString(&ub_string,(double)this->mipsolver->orig_model_->sense_ * lb,"");
        pHVar5 = this->mipsolver->options_mip_;
        solutionSourceToString_abi_cxx11_((string *)&dual_bound,pHVar10,solution_source,true);
        uVar6 = HighsCutPool::getNumCuts(&this->cutpool);
        uVar7 = HighsConflictPool::getNumConflicts(&this->conflictPool);
        highsLogUser(&(pHVar5->super_HighsOptionsStruct).log_options,kInfo,
                     " %s %7s %7s   %7s %6.2f%%   %-15s %-15s %8.2f   %6d %6d %6d   %7s%s\n",dVar12,
                     dVar13 * 100.0,dual_bound,&print_nodes,&queue_nodes,&print_leaves,&ub_string,
                     &primal_bound,(ulong)uVar6,(ulong)uVar11,(ulong)uVar7,&print_lp_iters,
                     time_string._M_dataplus._M_p);
      }
      else {
        primal_bound = 0.0;
        acStack_130[0] = '\0';
        acStack_130[1] = '\0';
        acStack_130[2] = '\0';
        acStack_130[3] = '\0';
        acStack_130[4] = '\0';
        acStack_130[5] = '\0';
        acStack_130[6] = '\0';
        acStack_130[7] = '\0';
        acStack_130[8] = '\0';
        acStack_130[9] = '\0';
        acStack_130[10] = '\0';
        acStack_130[0xb] = '\0';
        acStack_130[0xc] = '\0';
        acStack_130[0xd] = '\0';
        if (9999.0 <= dVar13 * 100.0) {
          primal_bound = 2.15179050153524e-312;
        }
        else {
          snprintf((char *)&primal_bound,0x16,"%.2f%%");
        }
        pdVar1 = &(this->mipsolver->options_mip_->super_HighsOptionsStruct).objective_bound;
        pcVar9 = "*";
        if (local_118 < *pdVar1 || local_118 == *pdVar1) {
          pcVar9 = "";
        }
        convertToPrintString
                  (&ub_string,(double)this->mipsolver->orig_model_->sense_ * local_118,pcVar9);
        pHVar10 = (HighsMipSolverData *)0x3a6f0e;
        convertToPrintString(&lb_string,(double)this->mipsolver->orig_model_->sense_ * lb,"");
        pHVar5 = this->mipsolver->options_mip_;
        solutionSourceToString_abi_cxx11_((string *)&dual_bound,pHVar10,solution_source,true);
        uVar6 = HighsCutPool::getNumCuts(&this->cutpool);
        uVar7 = HighsConflictPool::getNumConflicts(&this->conflictPool);
        highsLogUser(&(pHVar5->super_HighsOptionsStruct).log_options,kInfo,
                     " %s %7s %7s   %7s %6.2f%%   %-15s %-15s %8s   %6d %6d %6d   %7s%s\n",dVar12,
                     dual_bound,&print_nodes,&queue_nodes,&print_leaves,&lb_string,&ub_string,
                     &primal_bound,(ulong)uVar6,(ulong)uVar11,(ulong)uVar7,&print_lp_iters,
                     time_string._M_dataplus._M_p);
      }
      std::__cxx11::string::~string((string *)&dual_bound);
      limitsToBounds(this,&dual_bound,&primal_bound,(double *)&ub_string);
      HighsCallback::clearHighsCallbackDataOut(this->mipsolver->callback_);
      dVar12 = this->mipsolver->solution_objective_;
      std::__cxx11::string::string((string *)&local_70,"MIP logging",(allocator *)&lb_string);
      interruptFromCallbackWithData(this,5,dVar12,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&time_string);
    }
  }
  return;
}

Assistant:

void HighsMipSolverData::printDisplayLine(const int solution_source) {
  // MIP logging method
  //
  // Note that if the original problem is a maximization, the cost
  // coefficients are negated so that the MIP solver only solves a
  // minimization. Hence, in preparing to print the display line, the
  // dual bound (lb) is always less than the primal bound (ub). When
  // printed, the sense of the optimization is applied so that the
  // values printed correspond to the original objective.

  // No point in computing all the logging values if logging is off
  bool output_flag = *mipsolver.options_mip_->log_options.output_flag;
  if (!output_flag) return;

  bool timeless_log = mipsolver.options_mip_->timeless_log;
  disptime = timeless_log ? disptime + 1 : mipsolver.timer_.read();
  if (solution_source == kSolutionSourceNone &&
      disptime - last_disptime <
          mipsolver.options_mip_->mip_min_logging_interval)
    return;
  last_disptime = disptime;
  std::string time_string =
      timeless_log ? "" : highsFormatToString(" %7.1fs", disptime);

  if (num_disp_lines % 20 == 0) {
    if (num_disp_lines == 0) printSolutionSourceKey();
    std::string work_string0 = timeless_log ? "   Work" : "      Work      ";
    std::string work_string1 = timeless_log ? "LpIters" : "LpIters     Time";
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 // clang-format off
	"\n        Nodes      |    B&B Tree     |            Objective Bounds              |  Dynamic Constraints | %s\n"
	  "Src  Proc. InQueue |  Leaves   Expl. | BestBound       BestSol              Gap |   Cuts   InLp Confl. | %s\n\n",
                 // clang-format on
                 work_string0.c_str(), work_string1.c_str());

    //"   %7s | %10s | %10s | %10s | %10s | %-15s | %-15s | %7s | %7s "
    //"| %8s | %8s\n",
    //"time", "open nodes", "nodes", "leaves", "lpiters", "dual bound",
    //"primal bound", "cutpool", "confl.", "gap", "explored");
  }

  ++num_disp_lines;

  auto print_nodes = convertToPrintString(num_nodes);
  auto queue_nodes = convertToPrintString(nodequeue.numActiveNodes());
  auto print_leaves = convertToPrintString(num_leaves - num_leaves_before_run);

  double explored = 100 * double(pruned_treeweight);

  double lb;
  double ub;
  double gap = limitsToGap(lower_bound, upper_bound, lb, ub);
  gap *= 1e2;
  if (mipsolver.options_mip_->objective_bound < ub)
    ub = mipsolver.options_mip_->objective_bound;

  auto print_lp_iters = convertToPrintString(total_lp_iterations);
  HighsInt dynamic_constraints_in_lp =
      lp.numRows() > 0 ? lp.numRows() - lp.getNumModelRows() : 0;
  if (upper_bound != kHighsInf) {
    std::array<char, 22> gap_string = {};
    if (gap >= 9999.)
      std::strcpy(gap_string.data(), "Large");
    else
      std::snprintf(gap_string.data(), gap_string.size(), "%.2f%%", gap);

    std::array<char, 22> ub_string;
    if (mipsolver.options_mip_->objective_bound < ub) {
      ub_string =
          convertToPrintString((int)mipsolver.orig_model_->sense_ * ub, "*");
    } else
      ub_string = convertToPrintString((int)mipsolver.orig_model_->sense_ * ub);

    auto lb_string =
        convertToPrintString((int)mipsolver.orig_model_->sense_ * lb);

    highsLogUser(
        mipsolver.options_mip_->log_options, HighsLogType::kInfo,
        // clang-format off
                 " %s %7s %7s   %7s %6.2f%%   %-15s %-15s %8s   %6" HIGHSINT_FORMAT " %6" HIGHSINT_FORMAT " %6" HIGHSINT_FORMAT "   %7s%s\n",
        // clang-format on
        solutionSourceToString(solution_source).c_str(), print_nodes.data(),
        queue_nodes.data(), print_leaves.data(), explored, lb_string.data(),
        ub_string.data(), gap_string.data(), cutpool.getNumCuts(),
        dynamic_constraints_in_lp, conflictPool.getNumConflicts(),
        print_lp_iters.data(), time_string.c_str());
  } else {
    std::array<char, 22> ub_string;
    if (mipsolver.options_mip_->objective_bound < ub) {
      ub_string =
          convertToPrintString((int)mipsolver.orig_model_->sense_ * ub, "*");
    } else
      ub_string = convertToPrintString((int)mipsolver.orig_model_->sense_ * ub);

    auto lb_string =
        convertToPrintString((int)mipsolver.orig_model_->sense_ * lb);

    highsLogUser(
        mipsolver.options_mip_->log_options, HighsLogType::kInfo,
        // clang-format off
        " %s %7s %7s   %7s %6.2f%%   %-15s %-15s %8.2f   %6" HIGHSINT_FORMAT " %6" HIGHSINT_FORMAT " %6" HIGHSINT_FORMAT "   %7s%s\n",
        // clang-format on
        solutionSourceToString(solution_source).c_str(), print_nodes.data(),
        queue_nodes.data(), print_leaves.data(), explored, lb_string.data(),
        ub_string.data(), gap, cutpool.getNumCuts(), dynamic_constraints_in_lp,
        conflictPool.getNumConflicts(), print_lp_iters.data(),
        time_string.c_str());
  }
  // Check that limitsToBounds yields the same values for the
  // dual_bound, primal_bound (modulo optimization sense) and
  // mip_rel_gap
  double dual_bound;
  double primal_bound;
  double mip_rel_gap;
  limitsToBounds(dual_bound, primal_bound, mip_rel_gap);
  mip_rel_gap *= 1e2;
  assert(dual_bound == (int)mipsolver.orig_model_->sense_ * lb);
  assert(primal_bound == (int)mipsolver.orig_model_->sense_ * ub);
  assert(gap == mip_rel_gap);

  // Possibly interrupt from MIP logging callback
  mipsolver.callback_->clearHighsCallbackDataOut();
  const bool interrupt = interruptFromCallbackWithData(
      kCallbackMipLogging, mipsolver.solution_objective_, "MIP logging");
  assert(!interrupt);
}